

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O2

void ppDiv(word *q,word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  ulong *puVar1;
  undefined8 *puVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  word *b_00;
  ulong uVar7;
  word wVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  size_t local_40;
  
  sVar5 = wwBitSize(a,n);
  sVar6 = wwBitSize(b,m);
  uVar11 = m;
  if (sVar5 < sVar6) {
    wwSetZero(q,(n - m) + 1);
  }
  else {
    puVar1 = (ulong *)((long)stack + n * 8);
    puVar2 = (undefined8 *)((long)stack + n * 8);
    b_00 = puVar2 + 1;
    lVar3 = m * 8 + 8;
    wwCopy((word *)stack,a,n);
    *puVar2 = 0;
    wwCopy(b_00,b,m);
    sVar5 = wwBitSize(b + (m - 1),1);
    uVar4 = (int)sVar5 - 1U & 0x3f;
    if (uVar4 == 0) {
      q[n - m] = 0;
      uVar11 = m - 1;
      r[m - 1] = 0;
      local_40 = 0;
    }
    else {
      local_40 = 0x40 - (ulong)uVar4;
      wwShHi((word *)stack,n + 1,local_40);
      wwShHi(b_00,m,local_40);
    }
    puVar1[m + 1] = 0;
    puVar1[m + 2] = 1;
    puVar1[m + 3] = puVar1[m + (1 - ((long)puVar1[uVar11] >> 0x3f))] ^ 2;
    puVar1[m + 4] = puVar1[m + (ulong)(-1 < (long)puVar1[uVar11]) + 1] ^ 2;
    puVar1[m + 5] = puVar1[m + (puVar1[uVar11] >> 0x3e) + 1] ^ 4;
    puVar1[m + 6] = puVar1[m + (ulong)((uint)(puVar1[uVar11] >> 0x3e) ^ 1) + 1] ^ 4;
    puVar1[m + 7] = puVar1[m + (ulong)((uint)(puVar1[uVar11] >> 0x3e) ^ 2) + 1] ^ 4;
    puVar1[m + 8] = puVar1[m + (~puVar1[uVar11] >> 0x3e) + 1] ^ 4;
    puVar1[m + 9] = puVar1[m + (puVar1[uVar11] >> 0x3d) + 1] ^ 8;
    puVar1[m + 10] = puVar1[m + (ulong)((uint)(puVar1[uVar11] >> 0x3d) ^ 1) + 1] ^ 8;
    puVar1[m + 0xb] = puVar1[m + (ulong)((uint)(puVar1[uVar11] >> 0x3d) ^ 2) + 1] ^ 8;
    puVar1[m + 0xc] = puVar1[m + (ulong)((uint)(puVar1[uVar11] >> 0x3d) ^ 3) + 1] ^ 8;
    puVar1[m + 0xd] = puVar1[m + (ulong)((uint)(puVar1[uVar11] >> 0x3d) ^ 4) + 1] ^ 8;
    puVar1[m + 0xe] = puVar1[m + (ulong)((uint)(puVar1[uVar11] >> 0x3d) ^ 5) + 1] ^ 8;
    puVar1[m + 0xf] = puVar1[m + (ulong)((uint)(puVar1[uVar11] >> 0x3d) ^ 6) + 1] ^ 8;
    puVar1[m + 0x10] = puVar1[m + (~puVar1[uVar11] >> 0x3d) + 1] ^ 8;
    puVar1[m + 0x11] = 0;
    uVar10 = puVar1[uVar11];
    puVar1[m + 0x12] = uVar10;
    puVar1[m + 0x13] = uVar10 * 2;
    uVar7 = uVar10 * 2 ^ puVar1[uVar11];
    puVar1[m + 0x14] = uVar7;
    puVar1[m + 0x15] = uVar10 * 4;
    uVar9 = uVar10 * 4 ^ puVar1[uVar11];
    puVar1[m + 0x16] = uVar9;
    puVar1[m + 0x17] = uVar7 * 2;
    uVar12 = uVar7 * 2 ^ puVar1[uVar11];
    puVar1[m + 0x18] = uVar12;
    puVar1[m + 0x19] = uVar10 << 3;
    puVar1[m + 0x1a] = uVar10 << 3 ^ puVar1[uVar11];
    uVar9 = uVar9 * 2;
    puVar1[m + 0x1b] = uVar9;
    puVar1[m + 0x1c] = uVar9 ^ puVar1[uVar11];
    puVar1[m + 0x1d] = uVar7 << 2;
    puVar1[m + 0x1e] = uVar7 << 2 ^ puVar1[uVar11];
    uVar12 = uVar12 * 2;
    puVar1[m + 0x1f] = uVar12;
    puVar1[m + 0x20] = uVar12 ^ puVar1[uVar11];
    puVar13 = puVar1;
    for (sVar5 = n; uVar11 <= sVar5; sVar5 = sVar5 - 1) {
      uVar10 = *puVar13;
      uVar9 = puVar1[m + (uVar10 >> 0x3c) + 1];
      q[sVar5 - uVar11] = uVar9;
      uVar10 = puVar1[m + (ulong)((uint)uVar9 & 0xf) + 0x11] >> 4 ^ uVar10;
      uVar12 = puVar1[m + (ulong)((byte)(uVar10 >> 0x38) & 0xf) + 1];
      uVar7 = uVar9 << 4 ^ uVar12;
      q[sVar5 - uVar11] = uVar7;
      uVar10 = puVar1[m + (ulong)((uint)uVar12 & 0xf) + 0x11] >> 8 ^ uVar10;
      uVar9 = puVar1[m + (ulong)((uint)(uVar10 >> 0x34) & 0xf) + 1];
      uVar12 = uVar7 << 4 ^ uVar9;
      q[sVar5 - uVar11] = uVar12;
      uVar10 = puVar1[m + (ulong)((uint)uVar9 & 0xf) + 0x11] >> 0xc ^ uVar10;
      uVar9 = puVar1[m + (ulong)((ushort)(uVar10 >> 0x30) & 0xf) + 1];
      uVar12 = uVar12 << 4 ^ uVar9;
      q[sVar5 - uVar11] = uVar12;
      uVar10 = puVar1[m + (ulong)((uint)uVar9 & 0xf) + 0x11] >> 0x10 ^ uVar10;
      uVar9 = puVar1[m + (ulong)((uint)(uVar10 >> 0x2c) & 0xf) + 1];
      uVar12 = uVar12 << 4 ^ uVar9;
      q[sVar5 - uVar11] = uVar12;
      uVar10 = puVar1[m + (ulong)((uint)uVar9 & 0xf) + 0x11] >> 0x14 ^ uVar10;
      uVar9 = puVar1[m + (ulong)((uint)(uVar10 >> 0x28) & 0xf) + 1];
      uVar12 = uVar12 << 4 ^ uVar9;
      q[sVar5 - uVar11] = uVar12;
      uVar10 = puVar1[m + (ulong)((uint)uVar9 & 0xf) + 0x11] >> 0x18 ^ uVar10;
      uVar9 = puVar1[m + (ulong)((uint)(uVar10 >> 0x24) & 0xf) + 1];
      uVar12 = uVar12 << 4 ^ uVar9;
      q[sVar5 - uVar11] = uVar12;
      uVar10 = puVar1[m + (ulong)((uint)uVar9 & 0xf) + 0x11] >> 0x1c ^ uVar10;
      uVar9 = puVar1[m + (ulong)((uint)(uVar10 >> 0x20) & 0xf) + 1];
      uVar12 = uVar12 << 4 ^ uVar9;
      q[sVar5 - uVar11] = uVar12;
      uVar4 = (uint)uVar10 ^ *(uint *)((long)puVar1 + (ulong)((uint)uVar9 & 0xf) * 8 + m * 8 + 0x8c)
      ;
      uVar10 = puVar1[m + (ulong)(uVar4 >> 0x1c) + 1];
      uVar9 = uVar12 << 4 ^ uVar10;
      q[sVar5 - uVar11] = uVar9;
      uVar4 = (uint)(puVar1[m + (ulong)((uint)uVar10 & 0xf) + 0x11] >> 0x24) ^ uVar4;
      uVar10 = *(ulong *)((long)puVar1 + (ulong)(uVar4 >> 0x15 & 0x78) + lVar3);
      uVar9 = uVar9 << 4 ^ uVar10;
      q[sVar5 - uVar11] = uVar9;
      uVar4 = (uint)(puVar1[m + (ulong)((uint)uVar10 & 0xf) + 0x11] >> 0x28) ^ uVar4;
      uVar10 = *(ulong *)((long)puVar1 + (ulong)(uVar4 >> 0x11 & 0x78) + lVar3);
      uVar9 = uVar9 << 4 ^ uVar10;
      q[sVar5 - uVar11] = uVar9;
      uVar4 = (uint)(puVar1[m + (ulong)((uint)uVar10 & 0xf) + 0x11] >> 0x2c) ^ uVar4;
      uVar10 = *(ulong *)((long)puVar1 + (ulong)(uVar4 >> 0xd & 0x78) + lVar3);
      uVar9 = uVar9 << 4 ^ uVar10;
      q[sVar5 - uVar11] = uVar9;
      uVar4 = *(ushort *)((long)puVar1 + (ulong)((uint)uVar10 & 0xf) * 8 + m * 8 + 0x8e) ^ uVar4;
      uVar10 = *(ulong *)((long)puVar1 + (ulong)(uVar4 >> 9 & 0x78) + lVar3);
      uVar9 = uVar9 << 4 ^ uVar10;
      q[sVar5 - uVar11] = uVar9;
      uVar4 = (uint)(puVar1[m + (ulong)((uint)uVar10 & 0xf) + 0x11] >> 0x34) ^ uVar4;
      uVar10 = *(ulong *)((long)puVar1 + (ulong)(uVar4 >> 5 & 0x78) + lVar3);
      uVar9 = uVar9 << 4 ^ uVar10;
      q[sVar5 - uVar11] = uVar9;
      uVar4 = *(byte *)((long)puVar1 + (ulong)((uint)uVar10 & 0xf) * 8 + m * 8 + 0x8f) ^ uVar4;
      uVar10 = *(ulong *)((long)puVar1 + (ulong)(uVar4 >> 1 & 0x78) + lVar3);
      uVar9 = uVar9 << 4 ^ uVar10;
      q[sVar5 - uVar11] = uVar9;
      uVar10 = uVar9 << 4 ^
               puVar1[m + (ulong)((uint)(puVar1[m + (ulong)((uint)uVar10 & 0xf) + 0x11] >> 0x3c) ^
                                 uVar4 & 0xf) + 1];
      q[sVar5 - uVar11] = uVar10;
      wVar8 = ppAddMulW(puVar13 + -uVar11,b_00,uVar11,uVar10,puVar1 + m + 0x21);
      uVar10 = *puVar13;
      *puVar13 = wVar8 ^ uVar10;
      *puVar13 = wVar8 ^ uVar10 ^ q[sVar5 - uVar11];
      puVar13 = puVar13 + -1;
    }
    wwShLo((word *)stack,n + 1,local_40);
    a = (word *)stack;
  }
  wwCopy(r,a,uVar11);
  return;
}

Assistant:

void ppDiv(word q[], word r[], const word a[], size_t n, const word b[],
	size_t m, void* stack)
{
	register word dividentHi;
	register size_t shift;
	size_t i;
	// переменные в stack
	word* divident;		/* нормализованное делимое (n + 1 слово) */
	word* divisor;		/* нормализованный делитель (m слов) */
	word* w1;			/* таблица частных (16 слов) */
	word* w2;			/* таблица умножения (16 слов) */
	// pre
	ASSERT(n >= m);
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(wwIsDisjoint2(q, n + 1 - m, r, m));
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// deg(a) < deg(b)?
	if (wwBitSize(a, n) < wwBitSize(b, m))
	{
		// q <- 0, r <- a
		wwSetZero(q, n - m + 1);
		wwCopy(r, a, m);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	w1 = divisor + m;
	w2 = w1 + 16;
	stack = w2 + 16;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация -- сделать старший разряд divisor первым в старшем
	// (возможно неявном) слове
	shift = (wwBitSize(b + m - 1, 1) - 1) % B_PER_W;
	// нормализация не нужна?
	if (shift == 0)
		// обнуляем старшие слова q и r
		q[n - m] = 0, r[--m] = 0;
	else
		// сдвигаем divisor и divident
		shift = B_PER_W - shift,
		wwShHi(divident, n + 1, shift),
		wwShHi(divisor, m, shift);
	// строим таблицы
	_DIV_PRE_S4(w1, divisor[m - 1]);
	_MUL_PRE_S4(w2, divisor[m - 1]);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// q[i - m] <- divident[i] \div divisor[m - 1]
		dividentHi = divident[i];
		_DIV_DIV_S4(dividentHi, q[i - m], w1, w2);
		// divident <- divident - divisor * X^{i - m} * q[i - m]
		divident[i] ^=
			ppAddMulW(divident + i - m, divisor, m, q[i - m], stack);
		// обработаем неявный старший разряд divisor
		divident[i] ^= q[i - m];
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	shift = 0;
	dividentHi = 0;
}